

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableDatum *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  string local_1e0 [32];
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Variable Datum:");
  poVar1 = std::operator<<(poVar1,"\n\tID:          ");
  ENUMS::GetEnumAsStringDatumID_abi_cxx11_(&local_1c0,(ENUMS *)(ulong)this->m_ui32DatumID,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tLength:      ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tValue(S):    ");
  (*(this->super_DataTypeBase)._vptr_DataTypeBase[0xb])(local_1e0,this);
  poVar1 = std::operator<<(poVar1,local_1e0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString VariableDatum::GetAsString() const
{
    KStringStream ss;

    // For now we return the datum value as a string.
    ss << "Variable Datum:"
       << "\n\tID:          " << GetEnumAsStringDatumID( m_ui32DatumID )
       << "\n\tLength:      " << m_ui32DatumLength
       << "\n\tValue(S):    " << GetDatumValueAsKString()
       << "\n";

    return ss.str();
}